

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::collapse_selected_element(Mesh *this)

{
  Scene *pSVar1;
  HalfedgeElement *this_00;
  XFormWidget *pXVar2;
  Edge *pEVar3;
  Face *pFVar4;
  VertexIter VVar5;
  
  pSVar1 = (this->super_SceneObject).scene;
  if ((pSVar1 != (Scene *)0x0) &&
     (this_00 = (pSVar1->selected).element, this_00 != (HalfedgeElement *)0x0)) {
    pEVar3 = HalfedgeElement::getEdge(this_00);
    pFVar4 = HalfedgeElement::getFace(this_00);
    if (pEVar3 == (Edge *)0x0) {
      if (pFVar4 == (Face *)0x0) {
        return;
      }
      VVar5 = HalfedgeMesh::collapseFace(&this->mesh,(pFVar4->_halfedge)._M_node[3]._M_prev);
    }
    else {
      VVar5 = HalfedgeMesh::collapseEdge(&this->mesh,(pEVar3->_halfedge)._M_node[3]._M_next);
    }
    pSVar1 = (this->super_SceneObject).scene;
    (pSVar1->selected).element = (HalfedgeElement *)(VVar5._M_node + 1);
    (pSVar1->hovered).coordinates.z = 0.0;
    (pSVar1->hovered).object = (SceneObject *)0x0;
    (pSVar1->hovered).element = (HalfedgeElement *)0x0;
    (pSVar1->hovered).coordinates.x = 0.0;
    (pSVar1->hovered).coordinates.y = 0.0;
    (pSVar1->hovered).axis = None;
    pXVar2 = ((this->super_SceneObject).scene)->elementTransform;
    (pXVar2->target).coordinates.x = 0.0;
    (pXVar2->target).coordinates.y = 0.0;
    (pXVar2->target).object = (SceneObject *)0x0;
    (pXVar2->target).element = (HalfedgeElement *)0x0;
    (pXVar2->target).coordinates.z = 0.0;
    (pXVar2->target).axis = None;
  }
  return;
}

Assistant:

void Mesh::collapse_selected_element() {
   if( scene == nullptr ) return;
   HalfedgeElement *element = scene->selected.element;
   if (element == nullptr) return;
   Edge *edge = element->getEdge();
   Face *face = element->getFace();
   VertexIter v;

   if (edge != nullptr)
   {
      v = mesh.collapseEdge(edge->halfedge()->edge());
   }
   else if( face != nullptr )
   {
      v = mesh.collapseFace(face->halfedge()->face());
   }
   else
   {
      return;
   }

   scene->selected.element = elementAddress( v );
   scene->hovered.clear();
   scene->elementTransform->target.clear();
}